

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_check.c
# Opt level: O1

int check_logical_error_hz(mod2sparse *h,char *orig_error,char *decoding)

{
  uint n;
  int iVar1;
  int iVar2;
  char *out_vec;
  mod2sparse *r;
  mod2sparse *m2;
  
  iVar1 = h->n_rows;
  n = h->n_cols;
  out_vec = (char *)chk_alloc(n,1);
  bin_char_add(orig_error,decoding,out_vec,n);
  r = mod2sparse_allocate(n,iVar1);
  mod2sparse_transpose(h,r);
  m2 = mod2sparse_allocate(n,n);
  mod2sparse_merge_vec(r,out_vec,n,m2);
  iVar1 = mod2sparse_rank(h);
  iVar2 = mod2sparse_rank(m2);
  free(out_vec);
  mod2sparse_free(r);
  mod2sparse_free(m2);
  return (int)(iVar1 < iVar2);
}

Assistant:

int check_logical_error_hz(mod2sparse* h,char *orig_error,char *decoding){

    int logical_error = 0;

    int n = mod2sparse_cols(h);
    int c = mod2sparse_rows(h);

    char *residual=chk_alloc(n,sizeof(*residual));

    bin_char_add(orig_error,decoding,residual,n);

    mod2sparse *ht = mod2sparse_allocate(n,c);
    mod2sparse_transpose(h,ht);

    mod2sparse *htf = mod2sparse_allocate(n,n);

    mod2sparse_merge_vec(ht, residual, n, htf);

    int rank_ht = mod2sparse_rank(h); //we have rank(A^T) = rank(A)

    int rank_htf = mod2sparse_rank(htf);

    if (rank_ht < rank_htf) {
        logical_error = 1;
    }

    free(residual);

    mod2sparse_free(ht);
    mod2sparse_free(htf);

    return logical_error;

}